

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.h
# Opt level: O1

int __thiscall
JsUtil::
List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
::SetAtFirstFreeSpot
          (List<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_false,_Js::FreeListedRemovePolicy,_DefaultComparer>
           *this,RecyclerWeakReference<Js::Utf8SourceInfo> **item)

{
  WriteBarrierPtr<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_> *addr;
  RecyclerWeakReference<Js::Utf8SourceInfo> *pRVar1;
  int iVar2;
  Type *pTVar3;
  uint uVar4;
  
  iVar2 = (this->removePolicy).freeItemIndex;
  if (iVar2 == -1) {
    iVar2 = -1;
  }
  else {
    pTVar3 = Item(this,iVar2);
    uVar4 = *(uint *)&pTVar3->ptr >> 1;
    if (*(uint *)&pTVar3->ptr == 0xffffffff) {
      uVar4 = 0xffffffff;
    }
    (this->removePolicy).freeItemIndex = uVar4;
  }
  if (iVar2 != -1) {
    pRVar1 = *item;
    addr = (this->
           super_ReadOnlyList<Memory::RecyclerWeakReference<Js::Utf8SourceInfo>_*,_Memory::Recycler,_DefaultComparer>
           ).buffer.ptr + iVar2;
    Memory::Recycler::WBSetBit((char *)addr);
    addr->ptr = pRVar1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    return iVar2;
  }
  iVar2 = Add(this,item);
  return iVar2;
}

Assistant:

int SetAtFirstFreeSpot(const T& item)
        {
            int indexToSetAt = removePolicy.GetFreeItemIndex(this);

            if (indexToSetAt == -1)
            {
                return Add(item);
            }

            this->buffer[indexToSetAt] = item;
            return indexToSetAt;
        }